

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

bool __thiscall imrt::Station::canIncreaseIntensity(Station *this,int beam)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  bVar3 = 0 < this->max_apertures;
  if (0 < this->max_apertures) {
    lVar4 = 0;
    do {
      bVar2 = isOpenBeamlet(this,beam,(int)lVar4);
      if ((bVar2) &&
         (pdVar1 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar4,
         *pdVar1 <= (double)this->max_intensity && (double)this->max_intensity != *pdVar1)) {
        return bVar3;
      }
      lVar4 = lVar4 + 1;
      bVar3 = lVar4 < this->max_apertures;
    } while (lVar4 < this->max_apertures);
  }
  return bVar3;
}

Assistant:

bool Station::canIncreaseIntensity(int beam){
    for (int i =0;i<max_apertures;i++)
      if (isOpenBeamlet(beam,i) && intensity[i]<max_intensity) return(true);
      return(false);
  }